

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mobilitymodel.cpp
# Opt level: O0

void rev_calc(double longitude,double latitude,double height,double *res)

{
  ostream *poVar1;
  __type _Var2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double Z;
  double Y;
  double X;
  double N;
  double _eccentricitySquared;
  double f;
  double _radiusPolar;
  double _radiusEquator;
  double *res_local;
  double height_local;
  double latitude_local;
  double longitude_local;
  
  _Var2 = std::pow<double,int>(0.0033528106647474805,2);
  dVar3 = sin(latitude);
  dVar4 = sin(latitude);
  dVar3 = sqrt(-((-_Var2 + 0.006705621329494961) * dVar3) * dVar4 + 1.0);
  dVar3 = 6378137.0 / dVar3;
  dVar4 = cos(latitude);
  dVar5 = cos(longitude);
  dVar5 = (dVar3 + height) * dVar4 * dVar5;
  dVar4 = cos(latitude);
  dVar6 = sin(longitude);
  dVar6 = (dVar3 + height) * dVar4 * dVar6;
  dVar4 = sin(latitude);
  dVar4 = (dVar3 * (1.0 - (-_Var2 + 0.006705621329494961)) + height) * dVar4;
  *res = dVar5;
  res[1] = dVar6;
  res[2] = dVar4;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar5);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar6);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void rev_calc(double longitude, double latitude, double height, double* res){   //将经纬高（WGS84）转化为XYZ
    double _radiusEquator = 6378137;
    double _radiusPolar =  6356752.3142;
    double f = 1/298.257223563;
    double _eccentricitySquared = 2*f - pow(f,2);
    double N = _radiusEquator / sqrt( 1.0 - _eccentricitySquared*sin(latitude)*sin(latitude));
    double X = (N + height)*cos(latitude)*cos(longitude);
    double Y = (N + height)*cos(latitude)*sin(longitude);
    double Z = (N*(1.0-_eccentricitySquared) + height)*sin(latitude);
    res[0] = X;
    res[1] = Y;
    res[2] = Z;
    cout<<X<<"\t"<<Y<<"\t"<<Z<<endl;
}